

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

char * cert_expr_expression(CertExprBuilder *eb)

{
  strbuf *buf_o;
  char *pcVar1;
  size_t i;
  ulong uVar2;
  ptrlen pVar3;
  
  buf_o = strbuf_new();
  for (uVar2 = 0; uVar2 < eb->nwcs; uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      pVar3 = ptrlen_from_asciz(" || ");
      BinarySink_put_datapl(buf_o->binarysink_,pVar3);
    }
    pVar3 = ptrlen_from_asciz(eb->wcs[uVar2]);
    BinarySink_put_datapl(buf_o->binarysink_,pVar3);
  }
  pcVar1 = strbuf_to_str(buf_o);
  return pcVar1;
}

Assistant:

char *cert_expr_expression(CertExprBuilder *eb)
{
    strbuf *sb = strbuf_new();
    for (size_t i = 0; i < eb->nwcs; i++) {
        if (i)
            put_dataz(sb, " || ");
        put_dataz(sb, eb->wcs[i]);
    }
    return strbuf_to_str(sb);
}